

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::AdamOptimizer::_InternalParse
          (AdamOptimizer *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  DoubleParameter *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar3;
  Arena *pAVar4;
  char cVar5;
  uint res;
  pair<const_char_*,_unsigned_int> pVar6;
  byte *local_38;
  
  local_38 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_38;
      res = (uint)bVar1;
      pbVar3 = local_38 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar3 * 0x80) - 0x80;
        if ((char)*pbVar3 < '\0') {
          pVar6 = google::protobuf::internal::ReadTagFallback((char *)local_38,res);
          pbVar3 = (byte *)pVar6.first;
          res = pVar6.second;
        }
        else {
          pbVar3 = local_38 + 2;
        }
      }
      cVar5 = (char)res;
      local_38 = pbVar3;
      switch(res >> 3) {
      case 1:
        if (cVar5 != '\n') break;
        msg = this->learningrate_;
        if (msg == (DoubleParameter *)0x0) {
          pAVar4 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
          if ((this_00->ptr_ & 1U) != 0) {
            pAVar4 = *(Arena **)pAVar4;
          }
          msg = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::DoubleParameter>
                          (pAVar4);
          this->learningrate_ = msg;
        }
LAB_002a5d24:
        local_38 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                     (ctx,&msg->super_MessageLite,(char *)local_38);
        goto LAB_002a5d2f;
      case 2:
        if (cVar5 == '\x12') {
          msg = (DoubleParameter *)this->minibatchsize_;
          if (msg == (DoubleParameter *)0x0) {
            pAVar4 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              pAVar4 = *(Arena **)pAVar4;
            }
            msg = (DoubleParameter *)
                  google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Parameter>
                            (pAVar4);
            this->minibatchsize_ = (Int64Parameter *)msg;
          }
          goto LAB_002a5d24;
        }
        break;
      case 3:
        if (cVar5 == '\x1a') {
          msg = this->beta1_;
          if (msg == (DoubleParameter *)0x0) {
            pAVar4 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              pAVar4 = *(Arena **)pAVar4;
            }
            msg = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::DoubleParameter>(pAVar4);
            this->beta1_ = msg;
          }
          goto LAB_002a5d24;
        }
        break;
      case 4:
        if (cVar5 == '\"') {
          msg = this->beta2_;
          if (msg == (DoubleParameter *)0x0) {
            pAVar4 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              pAVar4 = *(Arena **)pAVar4;
            }
            msg = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::DoubleParameter>(pAVar4);
            this->beta2_ = msg;
          }
          goto LAB_002a5d24;
        }
        break;
      case 5:
        if (cVar5 == '*') {
          msg = this->eps_;
          if (msg == (DoubleParameter *)0x0) {
            pAVar4 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              pAVar4 = *(Arena **)pAVar4;
            }
            msg = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::DoubleParameter>(pAVar4);
            this->eps_ = msg;
          }
          goto LAB_002a5d24;
        }
      }
      if ((res == 0) || ((res & 7) == 4)) {
        if (pbVar3 == (byte *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        return (char *)pbVar3;
      }
      if ((this_00->ptr_ & 1U) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
      }
      local_38 = (byte *)google::protobuf::internal::UnknownFieldParse
                                   (res,unknown,(char *)local_38,ctx);
LAB_002a5d2f:
      if (local_38 == (byte *)0x0) {
        return (char *)0x0;
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_38;
}

Assistant:

const char* AdamOptimizer::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.DoubleParameter learningRate = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_learningrate(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Parameter miniBatchSize = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_minibatchsize(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.DoubleParameter beta1 = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_beta1(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.DoubleParameter beta2 = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_beta2(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.DoubleParameter eps = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_eps(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}